

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<long_double>_> *this,
          TPZFMatrix<std::complex<long_double>_> *v2)

{
  undefined8 *puVar1;
  longdouble lVar2;
  uint uVar3;
  int iVar4;
  pair<int,_int> *ppVar5;
  complex<long_double> *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  complex<long_double> *__z;
  complex<long_double> *pcVar9;
  ulong uVar10;
  long row;
  ulong uVar11;
  complex<long_double> __r;
  complex<long_double> local_58;
  
  SolveSystemZi(this);
  uVar3 = (uint)(this->fGlobalEqs).fNElements;
  uVar11 = 0;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    ppVar5 = (this->fGlobalEqs).fStore;
    row = (long)ppVar5[uVar11].first;
    iVar4 = ppVar5[uVar11].second;
    pcVar6 = (this->fWeights).super_TPZVec<std::complex<long_double>_>.fStore;
    __z = TPZFMatrix<std::complex<long_double>_>::operator()(&this->fzi,row,0);
    pcVar9 = pcVar6 + row;
    local_58._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
    uVar7 = *(undefined8 *)(pcVar9->_M_value + 8);
    puVar1 = (undefined8 *)(pcVar6[row]._M_value + 0x10);
    local_58._M_value._16_8_ = *puVar1;
    uVar8 = puVar1[1];
    local_58._M_value._8_2_ = SUB82(uVar7,0);
    local_58._M_value._10_6_ = SUB86((ulong)uVar7 >> 0x10,0);
    local_58._M_value._24_2_ = SUB82(uVar8,0);
    local_58._M_value._26_6_ = SUB86((ulong)uVar8 >> 0x10,0);
    std::complex<long_double>::operator*=(&local_58,__z);
    pcVar9 = TPZFMatrix<std::complex<long_double>_>::operator()(v2,(long)iVar4,0);
    lVar2 = *(longdouble *)(pcVar9->_M_value + 0x10);
    *(longdouble *)pcVar9->_M_value =
         *(longdouble *)pcVar9->_M_value +
         (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
    *(longdouble *)(pcVar9->_M_value + 0x10) =
         lVar2 + (longdouble)CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}